

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O1

void OnDiskDataset::merge
               (path *db_base,string *outname,
               vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets,
               TaskSpec *task)

{
  _Rb_tree_const_iterator<IndexType> __last1;
  OnDiskDataset *pOVar1;
  pointer pOVar2;
  uint64_t uVar3;
  long lVar4;
  pointer ppOVar5;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> fname_cache;
  source_loc loc_03;
  TaskSpec *task_00;
  bool bVar6;
  pointer ppOVar7;
  logger *plVar8;
  long *plVar9;
  undefined8 *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Base_ptr p_Var12;
  ostream *poVar13;
  runtime_error *prVar14;
  code **ppcVar15;
  OnDiskIndex *index;
  ulong uVar16;
  pointer pOVar17;
  OnDiskIndex *index_1;
  string_view_t fmt;
  string_view_t fmt_00;
  set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> tmp_types;
  string fname_list;
  set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> index_types;
  ofstream of;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_names;
  _Any_data local_378;
  code *local_368;
  _Rb_tree_const_iterator<IndexType> _Stack_360;
  _Base_ptr local_358;
  size_t local_350;
  path *local_338;
  string *local_330;
  path local_328;
  TaskSpec *local_2e0;
  undefined1 local_2d8 [40];
  pointer local_2b0;
  _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
  local_2a8;
  undefined1 local_278 [8];
  size_type sStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  pointer local_258;
  ios_base local_180 [264];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  uint7 uStack_67;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_338 = db_base;
  local_330 = outname;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((ulong)((long)(datasets->
                    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(datasets->
                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 9) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"merge requires at least 2 datasets");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppOVar7 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_2e0 = task;
  if (8 < (ulong)((long)(datasets->
                        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar7)) {
    uVar16 = 1;
    do {
      pOVar1 = *ppOVar7;
      if (*(size_t *)((long)&(pOVar1->taints)._M_t._M_impl + 0x28) !=
          *(size_t *)((long)&(ppOVar7[uVar16]->taints)._M_t._M_impl + 0x28)) {
LAB_00136ca8:
        std::__cxx11::stringstream::stringstream((stringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268._M_local_buf,"trying to merge \"",0x11);
        pOVar1 = *(datasets->
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_268._M_local_buf,(pOVar1->name)._M_dataplus._M_p,
                             (pOVar1->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" and \"",7);
        pOVar1 = (datasets->
                 super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar16];
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(pOVar1->name)._M_dataplus._M_p,(pOVar1->name)._M_string_length
                            );
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268._M_local_buf,"but they have different taints - aborting",
                   0x29);
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar14,(string *)local_378._M_pod_data);
        __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar6 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                        (*(_Base_ptr *)((long)&(pOVar1->taints)._M_t._M_impl + 0x18),
                         (_Base_ptr)((long)&(pOVar1->taints)._M_t._M_impl + 8),
                         *(_Base_ptr *)((long)&(ppOVar7[uVar16]->taints)._M_t._M_impl + 0x18));
      if (!bVar6) goto LAB_00136ca8;
      uVar16 = uVar16 + 1;
      ppOVar7 = (datasets->
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(datasets->
                                    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar7 >> 3
                             ));
  }
  pOVar17 = ((*ppOVar7)->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar2 = *(pointer *)
            ((long)&((*ppOVar7)->indices).
                    super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl + 8);
  if (pOVar17 != pOVar2) {
    do {
      local_278._0_4_ = pOVar17->ntype;
      std::
      _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
      ::_M_insert_unique<IndexType>(&local_2a8,(IndexType *)local_278);
      pOVar17 = pOVar17 + 1;
    } while (pOVar17 != pOVar2);
  }
  ppOVar7 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(datasets->
                        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar7)) {
    uVar16 = 1;
    __last1._M_node = (_Base_ptr)((long)&local_378 + 8);
    do {
      local_378._8_8_ = local_378._8_8_ & 0xffffffff00000000;
      local_368 = (code *)0x0;
      local_350 = 0;
      pOVar2 = *(pointer *)
                ((long)&(ppOVar7[uVar16]->indices).
                        super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl + 8);
      _Stack_360._M_node = __last1._M_node;
      local_358 = __last1._M_node;
      for (pOVar17 = (ppOVar7[uVar16]->indices).
                     super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
                     super__Vector_impl_data._M_start; pOVar17 != pOVar2; pOVar17 = pOVar17 + 1) {
        local_278._0_4_ = pOVar17->ntype;
        std::
        _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
        ::_M_insert_unique<IndexType>
                  ((_Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
                    *)&local_378,(IndexType *)local_278);
      }
      if (local_350 != local_2a8._M_impl.super__Rb_tree_header._M_node_count) {
LAB_00136d91:
        std::__cxx11::stringstream::stringstream((stringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268._M_local_buf,"trying to merge \"",0x11);
        pOVar1 = *(datasets->
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_268._M_local_buf,(pOVar1->name)._M_dataplus._M_p,
                             (pOVar1->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" and \"",7);
        pOVar1 = (datasets->
                 super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar16];
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(pOVar1->name)._M_dataplus._M_p,(pOVar1->name)._M_string_length
                            );
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268._M_local_buf,
                   "but these ones contain index(es) of different type(s)",0x35);
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar14,(string *)&local_328);
        __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar6 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<IndexType>,std::_Rb_tree_const_iterator<IndexType>>
                        (_Stack_360,__last1,
                         (_Rb_tree_const_iterator<IndexType>)
                         local_2a8._M_impl.super__Rb_tree_header._M_header._M_left);
      if (!bVar6) goto LAB_00136d91;
      std::
      _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
      ::~_Rb_tree((_Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
                   *)&local_378);
      uVar16 = uVar16 + 1;
      ppOVar7 = (datasets->
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(datasets->
                                    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar7 >> 3
                             ));
  }
  if (local_2e0 != (TaskSpec *)0x0) {
    LOCK();
    (local_2e0->work_estimated_).super___atomic_base<unsigned_long>._M_i =
         local_2a8._M_impl.super__Rb_tree_header._M_node_count << 0x18;
    UNLOCK();
  }
  plVar8 = spdlog::default_logger_raw();
  local_278 = (undefined1  [8])0x0;
  sStack_270 = 0;
  local_268._M_allocated_capacity = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  spdlog::logger::log<char[39],_nullptr>
            (plVar8,loc,debug,(char (*) [39])"Pre-checks succeeded, merge can begin.");
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_2a8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_2a8._M_impl.super__Rb_tree_header) {
    p_Var12 = local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      get_index_type_name_abi_cxx11_((string *)local_278,p_Var12[1]._M_color);
      plVar8 = spdlog::default_logger_raw();
      local_378._M_unused._M_object = (void *)0x0;
      local_378._8_8_ = 0;
      local_368 = (code *)0x0;
      loc_00.funcname = (char *)0x0;
      loc_00.filename = (char *)0x0;
      loc_00.line = 0;
      loc_00._12_4_ = 0;
      fmt.size_ = 0x15;
      fmt.data_ = "Load run offsets: {}.";
      spdlog::logger::log<std::__cxx11::string>
                (plVar8,loc_00,debug,fmt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
      }
      get_index_type_name_abi_cxx11_(&local_328._M_pathname,p_Var12[1]._M_color);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_328);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar11) {
        local_268._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_268._8_8_ = plVar9[3];
        local_278 = (undefined1  [8])&local_268;
      }
      else {
        local_268._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_278 = (undefined1  [8])*plVar9;
      }
      sStack_270 = plVar9[1];
      *plVar9 = (long)paVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append(local_278,(ulong)(local_330->_M_dataplus)._M_p);
      local_378._M_unused._M_object = &local_368;
      ppcVar15 = (code **)(puVar10 + 2);
      if ((code **)*puVar10 == ppcVar15) {
        local_368 = *ppcVar15;
        _Stack_360._M_node = (_Base_ptr)puVar10[3];
      }
      else {
        local_368 = *ppcVar15;
        local_378._M_unused._M_object = (code **)*puVar10;
      }
      local_378._8_8_ = puVar10[1];
      *puVar10 = ppcVar15;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_pathname._M_dataplus._M_p != &local_328._M_pathname.field_2) {
        operator_delete(local_328._M_pathname._M_dataplus._M_p,
                        local_328._M_pathname.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378);
      local_2d8._0_8_ = (pointer)0x0;
      local_2d8._8_8_ = (pointer)0x0;
      local_2d8._16_8_ = (pointer)0x0;
      ppOVar7 = (datasets->
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_2b0 = (datasets->
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (ppOVar7 != local_2b0) {
        do {
          pOVar1 = *ppOVar7;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)get_index_with_type(pOVar1,p_Var12[1]._M_color);
          uVar3 = (pOVar1->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>.
                  _M_payload.super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                  super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count;
          OnDiskIndex::read_run_offsets
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_328,
                     (OnDiskIndex *)paVar11);
          sStack_270 = CONCAT44(sStack_270._4_4_,(int)uVar3);
          local_278 = (undefined1  [8])paVar11;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_268,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_328);
          std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::
          emplace_back<IndexMergeHelper>
                    ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)local_2d8,
                     (IndexMergeHelper *)local_278);
          if ((void *)local_268._M_allocated_capacity != (void *)0x0) {
            operator_delete((void *)local_268._M_allocated_capacity,
                            (long)local_258 - local_268._0_8_);
          }
          if (local_328._M_pathname._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_328._M_pathname._M_dataplus._M_p,
                            local_328._M_pathname.field_2._M_allocated_capacity -
                            (long)local_328._M_pathname._M_dataplus._M_p);
          }
          ppOVar7 = ppOVar7 + 1;
        } while (ppOVar7 != local_2b0);
      }
      get_index_type_name_abi_cxx11_((string *)local_278,p_Var12[1]._M_color);
      plVar8 = spdlog::default_logger_raw();
      task_00 = local_2e0;
      local_328._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_328._M_pathname._M_string_length = 0;
      local_328._M_pathname.field_2._M_allocated_capacity = 0;
      loc_01.funcname = (char *)0x0;
      loc_01.filename = (char *)0x0;
      loc_01.line = 0;
      loc_01._12_4_ = 0;
      fmt_00.size_ = 0x12;
      fmt_00.data_ = "On disk merge: {}.";
      spdlog::logger::log<std::__cxx11::string>
                (plVar8,loc_01,debug,fmt_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
      }
      OnDiskIndex::on_disk_merge
                (local_338,(string *)&local_378,p_Var12[1]._M_color,
                 (vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)local_2d8,task_00);
      std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::~vector
                ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)local_2d8);
      if ((code **)local_378._M_unused._0_8_ != &local_368) {
        operator_delete(local_378._M_unused._M_object,(ulong)(local_368 + 1));
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != &local_2a8._M_impl.super__Rb_tree_header);
  }
  plVar8 = spdlog::default_logger_raw();
  local_278 = (undefined1  [8])0x0;
  sStack_270 = 0;
  local_268._M_allocated_capacity = 0;
  loc_02.funcname = (char *)0x0;
  loc_02.filename = (char *)0x0;
  loc_02.line = 0;
  loc_02._12_4_ = 0;
  spdlog::logger::log<char[22],_nullptr>(plVar8,loc_02,debug,(char (*) [22])"Merge filename lists.")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 "files.",local_330);
  std::ofstream::ofstream(local_278);
  lVar4 = *(long *)((long)local_278 + -0x18);
  *(undefined4 *)((long)&local_268 + lVar4 + 0xc) = 1;
  std::ios::clear((int)&stack0xfffffffffffffc68 + (int)lVar4 + 0x120);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (&local_328,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  std::experimental::filesystem::v1::__cxx11::path::path((path *)&local_378,local_338);
  std::experimental::filesystem::v1::__cxx11::path::_M_append
            ((path *)&local_378,&local_328._M_pathname);
  std::ofstream::open(local_278,(_Ios_Openmode)local_378._M_unused._M_member_pointer);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&local_378);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_328);
  ppOVar7 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar5 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar7 != ppOVar5) {
    do {
      local_378._8_8_ = 0;
      _Stack_360._M_node =
           (_Base_ptr)
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:204:13)>
           ::_M_invoke;
      local_368 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:204:13)>
                  ::_M_manager;
      local_378._M_unused._0_8_ = (undefined8)local_278;
      OnDiskFileIndex::for_each_filename
                ((OnDiskFileIndex *)&(*ppOVar7)->files_index,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_378);
      if (local_368 != (code *)0x0) {
        (*local_368)(&local_378,&local_378,3);
      }
      ppOVar7 = ppOVar7 + 1;
    } while (ppOVar7 != ppOVar5);
  }
  std::ostream::flush();
  local_68 = 0;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = (char *)uStack_70;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = local_78;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
       (ulong)uStack_67 << 8;
  store_dataset(local_338,local_330,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_60,(string *)local_2d8,fname_cache,
                &(*(datasets->
                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->taints);
  plVar8 = spdlog::default_logger_raw();
  local_378._M_unused._M_object = (void *)0x0;
  local_378._8_8_ = 0;
  local_368 = (code *)0x0;
  loc_03.funcname = (char *)0x0;
  loc_03.filename = (char *)0x0;
  loc_03.line = 0;
  loc_03._12_4_ = 0;
  spdlog::logger::log<char[29],_nullptr>
            (plVar8,loc_03,debug,(char (*) [29])"Merge finished successfully.");
  local_278 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_278 + *(long *)(_VTT + -0x18)) = _seekpos;
  std::filebuf::~filebuf((filebuf *)&sStack_270);
  std::ios_base::~ios_base(local_180);
  if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
    operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
  ::~_Rb_tree(&local_2a8);
  return;
}

Assistant:

void OnDiskDataset::merge(const fs::path &db_base, const std::string &outname,
                          const std::vector<const OnDiskDataset *> &datasets,
                          TaskSpec *task) {
    std::set<IndexType> index_types;

    if (datasets.size() < 2) {
        throw std::runtime_error("merge requires at least 2 datasets");
    }

    for (size_t i = 1; i < datasets.size(); i++) {
        if (!datasets[0]->is_taint_compatible(*datasets[i])) {
            std::stringstream ss;
            ss << "trying to merge \"" << datasets[0]->get_name() << "\" and \""
               << datasets[i]->get_name() << "\" ";
            ss << "but they have different taints - aborting";
            throw std::runtime_error(ss.str());
        }
    }

    for (const OnDiskIndex &index : datasets[0]->indices) {
        index_types.insert(index.index_type());
    }

    for (size_t i = 1; i < datasets.size(); i++) {
        std::set<IndexType> tmp_types;

        for (const OnDiskIndex &index : datasets[i]->indices) {
            tmp_types.insert(index.index_type());
        }

        if (tmp_types != index_types) {
            std::stringstream ss;
            ss << "trying to merge \"" << datasets[0]->get_name() << "\" and \""
               << datasets[i]->get_name() << "\" ";
            ss << "but these ones contain index(es) of different type(s)";
            throw std::runtime_error(ss.str());
        }
    }

    if (task != nullptr) {
        task->estimate_work(NUM_TRIGRAMS * index_types.size());
    }

    spdlog::debug("Pre-checks succeeded, merge can begin.");

    std::set<std::string> index_names;
    for (const auto &ndxtype : index_types) {
        spdlog::debug("Load run offsets: {}.", get_index_type_name(ndxtype));
        std::string index_name = get_index_type_name(ndxtype) + "." + outname;
        index_names.insert(index_name);
        std::vector<IndexMergeHelper> indexes;
        for (const OnDiskDataset *dataset : datasets) {
            const OnDiskIndex &index = dataset->get_index_with_type(ndxtype);
            indexes.emplace_back(
                IndexMergeHelper(&index, dataset->files_index->get_file_count(),
                                 index.read_run_offsets()));
        }
        spdlog::debug("On disk merge: {}.", get_index_type_name(ndxtype));
        OnDiskIndex::on_disk_merge(db_base, index_name, ndxtype, indexes, task);
    }

    spdlog::debug("Merge filename lists.");

    std::string fname_list = "files." + outname;
    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / fname_list, std::ofstream::binary);

    for (const OnDiskDataset *ds : datasets) {
        ds->files_index->for_each_filename(
            [&of](const std::string &fname) { of << fname << "\n"; });
    }
    of.flush();

    store_dataset(db_base, outname, index_names, fname_list, std::nullopt,
                  datasets[0]->get_taints());

    spdlog::debug("Merge finished successfully.");
}